

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

Property *
tinyusdz::detail::MakeProperty<tinyusdz::Token>(Property *__return_storage_ptr__,Token *value)

{
  Attribute attr;
  Attribute local_2b8;
  
  Attribute::Attribute<tinyusdz::Token>(&local_2b8,value,true);
  Property::Property(__return_storage_ptr__,&local_2b8,false);
  AttrMetas::~AttrMetas(&local_2b8._metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_2b8._paths);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_2b8._var._ts._samples);
  if (local_2b8._var._value.v_.vtable != (vtable_type *)0x0) {
    (*(local_2b8._var._value.v_.vtable)->destroy)((storage_union *)&local_2b8._var);
    local_2b8._var._value.v_.vtable = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._type_name._M_dataplus._M_p != &local_2b8._type_name.field_2) {
    operator_delete(local_2b8._type_name._M_dataplus._M_p,
                    local_2b8._type_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._name._M_dataplus._M_p != &local_2b8._name.field_2) {
    operator_delete(local_2b8._name._M_dataplus._M_p,
                    local_2b8._name.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Property MakeProperty(const T &value) {
  Attribute attr(value);
  Property prop(attr, /* custom */ false);

  return prop;
}